

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O1

void __thiscall Fl_Text_Display::draw_cursor(Fl_Text_Display *this,int X,int Y)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  ulong uVar13;
  Segment segs [5];
  uint local_88 [7];
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c [3];
  
  iVar5 = (this->text_area).x;
  if (X < iVar5 + -1) {
    return;
  }
  if (iVar5 + (this->text_area).w < X) {
    return;
  }
  if (5 < (uint)this->mCursorStyle) {
    bVar1 = false;
    iVar5 = 0;
    goto LAB_001d4e74;
  }
  iVar5 = this->mMaxsize;
  uVar2 = (Y + iVar5) - 1;
  puVar4 = &local_4c;
  puVar9 = &local_50;
  puVar10 = &local_54;
  puVar11 = &local_58;
  uVar6 = X - 2;
  uVar12 = X + 2;
  uVar8 = X;
  uVar7 = uVar2;
  uVar3 = uVar2;
  local_88[0] = uVar6;
  local_88[2] = X;
  local_88[3] = uVar2;
  switch(this->mCursorStyle) {
  case 0:
    local_88[2] = uVar12;
    local_88[5] = Y;
    local_6c = uVar2;
    goto LAB_001d4d8e;
  case 1:
    iVar5 = (int)((ulong)((long)iVar5 * -0x66666667) >> 0x20);
    iVar5 = (iVar5 >> 1) - (iVar5 >> 0x1f);
    local_88[3] = iVar5 + uVar2;
    uVar7 = (uVar2 + iVar5) - 1;
    iVar5 = 4;
    local_88[1] = uVar2;
    local_88[4] = X;
    local_88[5] = local_88[3];
    local_88[6] = uVar12;
    local_6c = uVar2;
    local_68 = uVar6;
    local_64 = uVar2;
    local_60 = X;
    local_5c = uVar7;
    break;
  case 2:
    local_88[5] = iVar5 / 2 + Y;
    local_88[0] = X;
    local_88[2] = X;
    local_6c = local_88[5];
LAB_001d4d8e:
    puVar9 = &local_60;
    iVar5 = 3;
    puVar4 = &local_5c;
    puVar10 = &local_64;
    puVar11 = &local_68;
    uVar12 = local_88[2];
    uVar8 = local_88[0];
    local_88[1] = Y;
    local_88[3] = Y;
    local_88[4] = X;
    local_88[6] = X;
    break;
  case 3:
    local_88[2] = X + 6;
    iVar5 = 4;
    uVar12 = X;
    uVar3 = Y;
    local_88[0] = X;
    local_88[1] = Y;
    local_88[3] = Y;
    local_88[4] = local_88[2];
    local_88[5] = Y;
    local_88[6] = local_88[2];
    local_6c = uVar2;
    local_68 = local_88[2];
    local_64 = uVar2;
    local_60 = X;
    local_5c = uVar2;
    break;
  case 4:
    puVar4 = local_3c;
    puVar9 = &local_40;
    local_88[2] = X - 1;
    local_60 = X + 1;
    iVar5 = 5;
    puVar10 = &local_44;
    puVar11 = &local_48;
    uVar8 = uVar6;
    local_88[0] = local_88[2];
    local_88[1] = Y;
    local_88[4] = X;
    local_88[5] = Y;
    local_88[6] = X;
    local_6c = uVar2;
    local_68 = local_60;
    local_64 = Y;
    local_5c = uVar2;
    local_58 = uVar6;
    local_54 = Y;
    local_50 = uVar12;
    local_4c = Y;
    break;
  case 5:
    puVar4 = &local_6c;
    puVar9 = local_88 + 6;
    iVar5 = 2;
    puVar10 = local_88 + 5;
    puVar11 = local_88 + 4;
    uVar12 = X + 1U;
    uVar8 = X + 1U;
    uVar7 = Y;
    local_88[0] = X;
    local_88[1] = Y;
  }
  *puVar11 = uVar8;
  *puVar10 = uVar7;
  *puVar9 = uVar12;
  *puVar4 = uVar3;
  bVar1 = true;
LAB_001d4e74:
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
            (fl_graphics_driver,(ulong)this->mCursor_color);
  if (bVar1) {
    uVar13 = 0;
    do {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                (fl_graphics_driver,(ulong)*(uint *)((long)local_88 + uVar13),
                 (ulong)*(uint *)((long)local_88 + uVar13 + 4),
                 (ulong)*(uint *)((long)local_88 + uVar13 + 8),
                 (ulong)*(uint *)((long)local_88 + uVar13 + 0xc));
      uVar13 = uVar13 + 0x10;
    } while ((iVar5 + (uint)(iVar5 == 0)) * 0x10 != uVar13);
  }
  return;
}

Assistant:

void Fl_Text_Display::draw_cursor( int X, int Y ) {

  typedef struct {
    int x1, y1, x2, y2;
  }
  Segment;

  Segment segs[ 5 ];
  int left, right, cursorWidth, midY;
  //    int fontWidth = mFontStruct->min_bounds.width, nSegs = 0;
  int fontWidth = TMPFONTWIDTH; // CET - FIXME
  int nSegs = 0;
  int fontHeight = mMaxsize;
  int bot = Y + fontHeight - 1;

  if ( X < text_area.x - 1 || X > text_area.x + text_area.w )
    return;

#ifdef __APPLE__
  Fl::insertion_point_location(X, bot, fontHeight);
#endif
  /* For cursors other than the block, make them around 2/3 of a character
   width, rounded to an even number of pixels so that X will draw an
   odd number centered on the stem at x. */
  cursorWidth = 4;   //(fontWidth/3) * 2;
  left = X - cursorWidth / 2;
  right = left + cursorWidth;

  /* Create segments and draw cursor */
  if ( mCursorStyle == CARET_CURSOR ) {
    midY = bot - fontHeight / 5;
    segs[ 0 ].x1 = left; segs[ 0 ].y1 = bot; segs[ 0 ].x2 = X; segs[ 0 ].y2 = midY;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = midY; segs[ 1 ].x2 = right; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = left; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = X; segs[ 2 ].y2 = midY - 1;
    segs[ 3 ].x1 = X; segs[ 3 ].y1 = midY - 1; segs[ 3 ].x2 = right; segs[ 3 ].y2 = bot;
    nSegs = 4;
  } else if ( mCursorStyle == NORMAL_CURSOR ) {
    segs[ 0 ].x1 = left; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = right; segs[ 0 ].y2 = Y;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = X; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = left; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = right; segs[ 2 ].y2 = bot;
    nSegs = 3;
  } else if ( mCursorStyle == HEAVY_CURSOR ) {
    segs[ 0 ].x1 = X - 1; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = X - 1; segs[ 0 ].y2 = bot;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = X; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = X + 1; segs[ 2 ].y1 = Y; segs[ 2 ].x2 = X + 1; segs[ 2 ].y2 = bot;
    segs[ 3 ].x1 = left; segs[ 3 ].y1 = Y; segs[ 3 ].x2 = right; segs[ 3 ].y2 = Y;
    segs[ 4 ].x1 = left; segs[ 4 ].y1 = bot; segs[ 4 ].x2 = right; segs[ 4 ].y2 = bot;
    nSegs = 5;
  } else if ( mCursorStyle == DIM_CURSOR ) {
    midY = Y + fontHeight / 2;
    segs[ 0 ].x1 = X; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = X; segs[ 0 ].y2 = Y;
    segs[ 1 ].x1 = X; segs[ 1 ].y1 = midY; segs[ 1 ].x2 = X; segs[ 1 ].y2 = midY;
    segs[ 2 ].x1 = X; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = X; segs[ 2 ].y2 = bot;
    nSegs = 3;
  } else if ( mCursorStyle == BLOCK_CURSOR ) {
    right = X + fontWidth;
    segs[ 0 ].x1 = X; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = right; segs[ 0 ].y2 = Y;
    segs[ 1 ].x1 = right; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = right; segs[ 1 ].y2 = bot;
    segs[ 2 ].x1 = right; segs[ 2 ].y1 = bot; segs[ 2 ].x2 = X; segs[ 2 ].y2 = bot;
    segs[ 3 ].x1 = X; segs[ 3 ].y1 = bot; segs[ 3 ].x2 = X; segs[ 3 ].y2 = Y;
    nSegs = 4;
  } else if ( mCursorStyle == SIMPLE_CURSOR ){
    segs[ 0 ].x1 = X; segs[ 0 ].y1 = Y; segs[ 0 ].x2 = X; segs[ 0 ].y2 = bot;
    segs[ 1 ].x1 = X+1; segs[ 1 ].y1 = Y; segs[ 1 ].x2 = X+1; segs[ 1 ].y2 = bot;
    nSegs = 2;
  }
  fl_color( mCursor_color );

  for ( int k = 0; k < nSegs; k++ ) {
    fl_line( segs[ k ].x1, segs[ k ].y1, segs[ k ].x2, segs[ k ].y2 );
  }
}